

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::OneHotEncoder::_InternalSerialize
          (OneHotEncoder *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  StringVector *this_00;
  Int64Vector *this_01;
  void *data;
  bool bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int size;
  ulong uVar7;
  uint8_t *puVar8;
  size_t __n;
  
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->CategoryType_).stringcategories_;
    *target = '\n';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar5;
    if (uVar5 < 0x80) {
      puVar8 = target + 2;
    }
    else {
      puVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar5,target + 1);
    }
    target = StringVector::_InternalSerialize(this_00,puVar8,stream);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 2) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->CategoryType_).int64categories_;
    *target = '\x12';
    uVar5 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar5;
    if (uVar5 < 0x80) {
      puVar8 = target + 2;
    }
    else {
      puVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar5,target + 1);
    }
    target = Int64Vector::_InternalSerialize(this_01,puVar8,stream);
  }
  if (this->outputsparse_ == true) {
    uVar2 = '\x01';
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar2 = this->outputsparse_;
    }
    *target = 'P';
    target[1] = uVar2;
    target = target + 2;
  }
  uVar5 = this->handleunknown_;
  puVar8 = target;
  if (uVar5 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar5 = this->handleunknown_;
    }
    *target = 'X';
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      puVar8 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (uint8_t)((ulong)(long)(int)uVar5 >> 7);
      puVar8 = target + 3;
      if (0x3fff < uVar5) {
        uVar7 = (ulong)target[2];
        uVar4 = (ulong)(long)(int)uVar5 >> 7;
        do {
          puVar8[-1] = (byte)uVar7 | 0x80;
          uVar6 = uVar4 >> 7;
          *puVar8 = (uint8_t)uVar6;
          puVar8 = puVar8 + 1;
          uVar7 = uVar6 & 0xffffffff;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar6;
        } while (bVar1);
      }
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar8 < (long)__n) {
      puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar8);
      return puVar8;
    }
    memcpy(puVar8,data,__n);
    puVar8 = puVar8 + __n;
  }
  return puVar8;
}

Assistant:

uint8_t* OneHotEncoder::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.OneHotEncoder)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringVector stringCategories = 1;
  if (_internal_has_stringcategories()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::stringcategories(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64Categories = 2;
  if (_internal_has_int64categories()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::int64categories(this), target, stream);
  }

  // bool outputSparse = 10;
  if (this->_internal_outputsparse() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_outputsparse(), target);
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->_internal_handleunknown() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      11, this->_internal_handleunknown(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.OneHotEncoder)
  return target;
}